

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetBXToolInfo(ndicapi *pol,int portHandle,char *outToolInfo)

{
  char (*pacVar1) [11];
  ulong uVar2;
  
  pacVar1 = pol->BxToolMarkerInformation;
  uVar2 = 0;
  while( true ) {
    if (pol->BxHandleCount == uVar2) {
      return 1;
    }
    if (pol->BxHandles[uVar2] == portHandle) break;
    uVar2 = uVar2 + 1;
    pacVar1 = pacVar1 + 1;
  }
  if (pol->BxHandleCount == uVar2) {
    return 1;
  }
  *outToolInfo = (*pacVar1)[0];
  return 0;
}

Assistant:

ndicapiExport int ndiGetBXToolInfo(ndicapi* pol, int portHandle, char& outToolInfo)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  outToolInfo = pol->BxToolMarkerInformation[i][0];
  return NDI_OKAY;
}